

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

CustomModel_CustomModelParamValue * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::New
          (CustomModel_CustomModelParamValue *this,Arena *arena)

{
  CustomModel_CustomModelParamValue *this_00;
  
  this_00 = (CustomModel_CustomModelParamValue *)operator_new(0x20);
  CustomModel_CustomModelParamValue(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CustomModel_CustomModelParamValue>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

CustomModel_CustomModelParamValue* CustomModel_CustomModelParamValue::New(::google::protobuf::Arena* arena) const {
  CustomModel_CustomModelParamValue* n = new CustomModel_CustomModelParamValue;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}